

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_image_section_cache.c
# Opt level: O0

int pt_iscache_read(pt_image_section_cache *iscache,uint8_t *buffer,uint64_t size,int isid,
                   uint64_t vaddr)

{
  int iVar1;
  int iVar2;
  int status;
  int errcode;
  uint64_t laddr;
  pt_section *section;
  uint64_t vaddr_local;
  uint64_t uStack_28;
  int isid_local;
  uint64_t size_local;
  uint8_t *buffer_local;
  pt_image_section_cache *iscache_local;
  
  if (((iscache == (pt_image_section_cache *)0x0) || (buffer == (uint8_t *)0x0)) || (size == 0)) {
    iscache_local._4_4_ = -2;
  }
  else {
    section = (pt_section *)vaddr;
    vaddr_local._4_4_ = isid;
    uStack_28 = size;
    size_local = (uint64_t)buffer;
    buffer_local = (uint8_t *)iscache;
    iscache_local._4_4_ = pt_iscache_lookup(iscache,(pt_section **)&laddr,(uint64_t *)&status,isid);
    if (-1 < iscache_local._4_4_) {
      if (section < _status) {
        pt_section_put((pt_section *)laddr);
        iscache_local._4_4_ = -0xd;
      }
      else {
        section = (pt_section *)((long)section - (long)_status);
        iVar1 = pt_section_map((pt_section *)laddr);
        if (iVar1 < 0) {
          pt_section_put((pt_section *)laddr);
          iscache_local._4_4_ = iVar1;
        }
        else {
          if (0xffff < uStack_28) {
            uStack_28 = 0xffff;
          }
          iVar1 = pt_section_read((pt_section *)laddr,(uint8_t *)size_local,(uint16_t)uStack_28,
                                  (uint64_t)section);
          iVar2 = pt_section_unmap((pt_section *)laddr);
          if (iVar2 < 0) {
            pt_section_put((pt_section *)laddr);
            iscache_local._4_4_ = iVar2;
          }
          else {
            iVar2 = pt_section_put((pt_section *)laddr);
            iscache_local._4_4_ = iVar1;
            if (iVar2 < 0) {
              iscache_local._4_4_ = iVar2;
            }
          }
        }
      }
    }
  }
  return iscache_local._4_4_;
}

Assistant:

int pt_iscache_read(struct pt_image_section_cache *iscache, uint8_t *buffer,
		    uint64_t size, int isid, uint64_t vaddr)
{
	struct pt_section *section;
	uint64_t laddr;
	int errcode, status;

	if (!iscache || !buffer || !size)
		return -pte_invalid;

	errcode = pt_iscache_lookup(iscache, &section, &laddr, isid);
	if (errcode < 0)
		return errcode;

	if (vaddr < laddr) {
		(void) pt_section_put(section);
		return -pte_nomap;
	}

	vaddr -= laddr;

	errcode = pt_section_map(section);
	if (errcode < 0) {
		(void) pt_section_put(section);
		return errcode;
	}

	/* We truncate the read if it gets too big.  The user is expected to
	 * issue further reads for the remaining part.
	 */
	if (UINT16_MAX < size)
		size = UINT16_MAX;

	status = pt_section_read(section, buffer, (uint16_t) size, vaddr);

	errcode = pt_section_unmap(section);
	if (errcode < 0) {
		(void) pt_section_put(section);
		return errcode;
	}

	errcode = pt_section_put(section);
	if (errcode < 0)
		return errcode;

	return status;
}